

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O3

bool __thiscall MeshLib::Solid::collapsable(Solid *this,HalfEdge *halfedge)

{
  HalfEdge *pHVar1;
  Face *pFVar2;
  Face *pFVar3;
  Vertex *pVVar4;
  tVertex pVVar5;
  tSolid pSVar6;
  tVertex pVVar7;
  VertexInHalfedgeIterator *pVVar8;
  Solid *pSVar9;
  Solid *pSVar10;
  bool bVar11;
  Vertex *this_00;
  Face *pFVar12;
  vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> thlist;
  List<MeshLib::Vertex> verts;
  HalfEdge *he;
  HalfEdge **local_98;
  iterator iStack_90;
  HalfEdge **local_88;
  VertexInHalfedgeIterator local_80;
  VertexVertexIterator local_68;
  tVertex local_58;
  Vertex *local_50;
  Vertex *local_48;
  Vertex *local_40;
  Edge *local_38;
  
  local_38 = halfedge->m_edge;
  local_80.m_vertex = halfedge->m_vertex;
  pHVar1 = local_38->m_halfedge[local_38->m_halfedge[0] == halfedge];
  if (pHVar1 == (HalfEdge *)0x0) {
    pFVar12 = (Face *)0x0;
    local_58 = (tVertex)0x0;
  }
  else {
    pFVar12 = pHVar1->m_face;
    local_58 = pHVar1->m_next->m_vertex;
  }
  pFVar2 = halfedge->m_face;
  local_50 = halfedge->m_prev->m_vertex;
  local_40 = halfedge->m_next->m_vertex;
  local_98 = (HalfEdge **)0x0;
  iStack_90._M_current = (HalfEdge **)0x0;
  local_88 = (HalfEdge **)0x0;
  local_80.m_solid = this;
  local_48 = local_80.m_vertex;
  local_80.m_halfedge = Vertex::most_clw_in_halfedge(local_80.m_vertex);
  if ((Vertex *)local_80.m_halfedge != (Vertex *)0x0) {
    do {
      pFVar3 = (Face *)((Point *)&(local_80.m_halfedge)->m_face)->v[0];
      local_68.m_vertex = (tVertex)local_80.m_halfedge;
      if ((pFVar3 != pFVar2) && (pFVar3 != pFVar12)) {
        if (iStack_90._M_current == local_88) {
          std::vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>>::
          _M_realloc_insert<MeshLib::HalfEdge*const&>
                    ((vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>> *)&local_98,
                     iStack_90,(HalfEdge **)&local_68);
        }
        else {
          *iStack_90._M_current = local_80.m_halfedge;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
      }
      VertexInHalfedgeIterator::operator++(&local_80);
    } while ((Vertex *)local_80.m_halfedge != (Vertex *)0x0);
  }
  local_80.m_vertex = local_50;
  local_80.m_solid = this;
  local_80.m_halfedge = Vertex::most_clw_in_halfedge(local_50);
  if ((Vertex *)local_80.m_halfedge != (Vertex *)0x0) {
    do {
      pFVar3 = (Face *)((Point *)&(local_80.m_halfedge)->m_face)->v[0];
      local_68.m_vertex = (tVertex)local_80.m_halfedge;
      if ((pFVar3 != pFVar2) && (pFVar3 != pFVar12)) {
        if (iStack_90._M_current == local_88) {
          std::vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>>::
          _M_realloc_insert<MeshLib::HalfEdge*const&>
                    ((vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>> *)&local_98,
                     iStack_90,(HalfEdge **)&local_68);
        }
        else {
          *iStack_90._M_current = local_80.m_halfedge;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
      }
      VertexInHalfedgeIterator::operator++(&local_80);
    } while ((Vertex *)local_80.m_halfedge != (Vertex *)0x0);
  }
  if (iStack_90._M_current != local_98) {
    iStack_90._M_current = local_98;
    local_80.m_vertex = local_40;
    local_80.m_solid = this;
    local_80.m_halfedge = Vertex::most_clw_in_halfedge(local_40);
    if ((Vertex *)local_80.m_halfedge != (Vertex *)0x0) {
      do {
        pFVar3 = (Face *)((Point *)&(local_80.m_halfedge)->m_face)->v[0];
        local_68.m_vertex = (tVertex)local_80.m_halfedge;
        if ((pFVar3 != pFVar2) && (pFVar3 != pFVar12)) {
          if (iStack_90._M_current == local_88) {
            std::vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>>::
            _M_realloc_insert<MeshLib::HalfEdge*const&>
                      ((vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>> *)&local_98,
                       iStack_90,(HalfEdge **)&local_68);
          }
          else {
            *iStack_90._M_current = local_80.m_halfedge;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
        }
        VertexInHalfedgeIterator::operator++(&local_80);
      } while ((Vertex *)local_80.m_halfedge != (Vertex *)0x0);
    }
    if (iStack_90._M_current != local_98) {
      this_00 = local_48;
      if (local_58 != (Vertex *)0x0) {
        iStack_90._M_current = local_98;
        local_80.m_vertex = local_58;
        local_80.m_solid = this;
        local_80.m_halfedge = Vertex::most_clw_in_halfedge(local_58);
        this_00 = local_48;
        if ((Vertex *)local_80.m_halfedge != (Vertex *)0x0) {
          do {
            pFVar3 = (Face *)((Point *)&(local_80.m_halfedge)->m_face)->v[0];
            local_68.m_vertex = (tVertex)local_80.m_halfedge;
            if ((pFVar3 != pFVar2) && (pFVar3 != pFVar12)) {
              if (iStack_90._M_current == local_88) {
                std::vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>>::
                _M_realloc_insert<MeshLib::HalfEdge*const&>
                          ((vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>> *)
                           &local_98,iStack_90,(HalfEdge **)&local_68);
              }
              else {
                *iStack_90._M_current = local_80.m_halfedge;
                iStack_90._M_current = iStack_90._M_current + 1;
              }
            }
            VertexInHalfedgeIterator::operator++(&local_80);
          } while ((Vertex *)local_80.m_halfedge != (Vertex *)0x0);
        }
        if (iStack_90._M_current == local_98) goto LAB_0010e8c1;
      }
      pVVar4 = local_40;
      if (((local_50->m_boundary != true) || (this_00->m_boundary != true)) ||
         ((local_38->m_halfedge[0] == (HalfEdge *)0x0) !=
          (local_38->m_halfedge[1] == (HalfEdge *)0x0))) {
        local_80.m_solid = (Solid *)0x0;
        local_80.m_vertex = (tVertex)((ulong)local_80.m_vertex & 0xffffffff00000000);
        local_68.m_vertex = local_50;
        local_68.m_halfedge = Vertex::most_clw_out_halfedge(local_50);
        pVVar7 = local_58;
        if (local_68.m_halfedge != (HalfEdge *)0x0) {
          do {
            pVVar5 = VertexVertexIterator::value(&local_68);
            if ((pVVar5 != pVVar4) && (pVVar5 != pVVar7)) {
              pSVar6 = (tSolid)operator_new(0x10);
              pSVar6->_vptr_Solid = (_func_int **)pVVar5;
              pVVar8 = &local_80;
              pSVar9 = local_80.m_solid;
              if (local_80.m_solid != (Solid *)0x0) {
                do {
                  pSVar10 = pSVar9;
                  pSVar9 = (Solid *)(pSVar10->m_edges).root;
                } while (pSVar9 != (Solid *)0x0);
                pVVar8 = (VertexInHalfedgeIterator *)&pSVar10->m_edges;
              }
              pVVar8->m_solid = pSVar6;
              (pSVar6->m_edges).root = (Node<MeshLib::Edge> *)0x0;
              local_80.m_vertex =
                   (tVertex)CONCAT44(local_80.m_vertex._4_4_,(int)local_80.m_vertex + 1);
            }
            VertexVertexIterator::operator++(&local_68);
          } while (local_68.m_halfedge != (HalfEdge *)0x0);
        }
        local_68.m_vertex = this_00;
        local_68.m_halfedge = Vertex::most_clw_out_halfedge(this_00);
        if (local_68.m_halfedge != (HalfEdge *)0x0) {
          do {
            pVVar7 = VertexVertexIterator::value(&local_68);
            for (pSVar9 = local_80.m_solid; pSVar9 != (Solid *)0x0;
                pSVar9 = (Solid *)(pSVar9->m_edges).root) {
              if ((tVertex)pSVar9->_vptr_Solid == pVVar7) {
                bVar11 = false;
                goto LAB_0010e8c7;
              }
            }
            VertexVertexIterator::operator++(&local_68);
          } while (local_68.m_halfedge != (HalfEdge *)0x0);
        }
        bVar11 = true;
LAB_0010e8c7:
        List<MeshLib::Vertex>::~List((List<MeshLib::Vertex> *)&local_80);
        goto LAB_0010e8d5;
      }
    }
  }
LAB_0010e8c1:
  bVar11 = false;
LAB_0010e8d5:
  if (local_98 != (HalfEdge **)0x0) {
    operator_delete(local_98);
  }
  return bVar11;
}

Assistant:

bool Solid::collapsable (HalfEdge * halfedge) {
	Edge * edge = halfedge->edge ();
	Vertex * source = halfedge->source ();
	Vertex * target = halfedge->target ();
	Face * fL = halfedge->face ();
	Face * fR = halfedge->he_sym ()!= NULL?halfedge->he_sym()->face ():NULL;
	Vertex * vL = halfedge->he_next ()->target ();
	Vertex * vR = halfedge->he_sym ()!= NULL? halfedge->he_sym ()->he_next ()->target ():NULL;
	std::vector <HalfEdge *> thlist;
	for( VertexInHalfedgeIterator vhiter( this, target );!vhiter.end(); ++ vhiter ) {
		HalfEdge * he = *vhiter;

		if( he->face() == fL ) continue;
		if( he->face() == fR ) continue;

		thlist.push_back ( he );
	}

	for( VertexInHalfedgeIterator svhiter( this, source );!svhiter.end(); ++ svhiter ) {
		HalfEdge * he = *svhiter;

		if( he->face() == fL ) continue;
		if( he->face() == fR ) continue;

		thlist.push_back ( he );
	}
	if(thlist.size () == 0) return false;

	thlist.clear ();
	for( VertexInHalfedgeIterator lvhiter( this, vL );!lvhiter.end(); ++ lvhiter )
	{
		HalfEdge * he = *lvhiter;

		if( he->face() == fL ) continue;
		if( he->face() == fR ) continue;

		thlist.push_back ( he );
	}
	if(thlist.size () == 0) return false;
	if( vR != NULL ) {
		thlist.clear ();
		for( VertexInHalfedgeIterator rvhiter( this, vR );!rvhiter.end(); ++ rvhiter ) {
			HalfEdge * he = *rvhiter;

			if( he->face() == fL ) continue;
			if( he->face() == fR ) continue;

			thlist.push_back ( he );
		}
		if(thlist.size () == 0) return false;
	}

	if( source->boundary() && target->boundary() && !edge->boundary() )
		return false;

	List<Vertex> verts;

	for( VertexVertexIterator vviter( source ); !vviter.end(); ++ vviter ) {
		Vertex * v = *vviter;
		if( v == vL ) continue;
		if( v == vR ) continue;
		verts.Append( v );
	}

	for( VertexVertexIterator viter(  target ); !viter.end(); ++ viter ) {
		Vertex * v = *viter;
		if( verts.contains( v ) ) return false;
	}

	return true;
}